

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

void __thiscall Fl_Input_::drawtext(Fl_Input_ *this,int X,int Y,int W,int H)

{
  char *e;
  uchar uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  undefined4 extraout_var;
  char *e_00;
  long lVar7;
  size_t sVar8;
  Fl_Window *win;
  int iVar9;
  undefined4 in_register_0000000c;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  Fl_Boxtype FVar13;
  undefined4 in_register_00000034;
  char *pcVar14;
  int iVar15;
  bool bVar16;
  float x;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int offset2;
  int offset1;
  char buf [1024];
  undefined8 in_stack_fffffffffffffb08;
  undefined4 uVar21;
  float local_4e4;
  uint local_4bc;
  int local_4b8;
  int local_4b4;
  int local_494;
  int local_490;
  int local_48c;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  float local_46c;
  float local_468;
  float local_464;
  float local_460;
  uint local_45c;
  long local_458;
  long local_450;
  ulong local_448;
  ulong local_440;
  char local_438 [1032];
  
  uVar1 = (this->super_Fl_Widget).damage_;
  if ((Fl_Input_ *)Fl::focus_ != this) {
    if (this->size_ == 0) {
      if ((char)uVar1 < '\0') {
        return;
      }
      FVar13 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
      iVar4 = Fl::box_dx(FVar13);
      iVar3 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
      iVar10 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
      iVar15 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
      Fl_Widget::draw_box(&this->super_Fl_Widget,FVar13,X - iVar4,Y - iVar3,W + iVar10,H + iVar15,
                          (this->super_Fl_Widget).color_);
      return;
    }
    local_4b4 = 0;
    local_4b8 = 0;
    if ((Fl_Input_ *)Fl::pushed_ != this) goto LAB_001ba62f;
  }
  iVar4 = this->position_;
  local_4b8 = this->mark_;
  local_4b4 = local_4b8;
  if (local_4b8 < iVar4) {
    local_4b4 = iVar4;
  }
  if (iVar4 < local_4b8) {
    local_4b8 = iVar4;
  }
LAB_001ba62f:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar10 = iVar3 / 2;
  pcVar14 = this->value_;
  local_480 = (ulong)(uint)(W - iVar10);
  iVar15 = 0;
  local_48c = 0;
  local_478 = 0;
  iVar4 = 0;
  while( true ) {
    e_00 = expand(this,pcVar14,local_438);
    lVar7 = (long)this->position_;
    pcVar12 = this->value_;
    if (((long)pcVar14 - (long)pcVar12 <= lVar7) && (lVar7 <= (long)e_00 - (long)pcVar12)) {
      dVar17 = expandpos(this,pcVar14,pcVar12 + lVar7,local_438,(int *)0x0);
      uVar11 = (uint)(dVar17 + 0.5);
      local_478 = (ulong)uVar11;
      if (((Fl_Input_ *)Fl::focus_ == this) && (was_up_down == 0)) {
        up_down_pos = (double)(int)uVar11;
      }
      iVar5 = this->xscroll_;
      if ((int)local_480 + iVar5 < (int)uVar11) {
        dVar17 = expandpos(this,pcVar14,e_00,local_438,(int *)0x0);
        iVar4 = (int)dVar17 + 4;
        if ((int)(iVar10 + uVar11) <= (int)dVar17 + 4) {
          iVar4 = iVar10 + uVar11;
        }
        iVar5 = this->xscroll_;
        iVar9 = iVar4 - W;
      }
      else {
        iVar9 = iVar5;
        if ((int)uVar11 < iVar5 + iVar10) {
          iVar9 = uVar11 - iVar10;
        }
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar4 = iVar15;
      if (iVar9 != iVar5) {
        this->xscroll_ = iVar9;
        this->mu_p = 0;
        this->erase_cursor_only = '\0';
      }
    }
    if (this->value_ + this->size_ <= e_00) break;
    pcVar14 = e_00 + 1;
    local_48c = local_48c + -1;
    iVar15 = iVar15 + iVar3;
  }
  if (((this->super_Fl_Widget).type_ & 7) == 4) {
    iVar10 = this->yscroll_;
    iVar15 = iVar10;
    if (iVar4 < iVar10) {
      iVar15 = iVar4;
    }
    iVar5 = (iVar3 - H) + iVar4;
    if (iVar4 <= (H - iVar3) + iVar15) {
      iVar5 = iVar15;
    }
    iVar4 = -1;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    if (iVar4 != iVar10) {
      this->yscroll_ = iVar4;
      this->mu_p = 0;
      this->erase_cursor_only = '\0';
    }
  }
  else {
    this->yscroll_ = (iVar3 - H) / 2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,CONCAT44(in_register_00000034,X),(ulong)(uint)Y,
             CONCAT44(in_register_0000000c,W));
  iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
  local_4bc = this->textcolor_;
  if (iVar4 == 0) {
    local_4bc = fl_inactive(local_4bc);
  }
  pcVar14 = this->value_;
  iVar10 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
  x = (float)((X - this->xscroll_) + 1);
  iVar4 = -this->yscroll_;
  if (iVar4 < H) {
    fVar18 = (float)(W + X);
    local_464 = (float)X;
    local_480 = CONCAT44(local_480._4_4_,-iVar3);
    local_468 = x + 2.0;
    local_46c = local_464 + -3.0;
    iVar5 = iVar3 + 3;
    iVar15 = iVar3 + 7;
    if (-1 < iVar3) {
      iVar5 = iVar3;
      iVar15 = iVar3;
    }
    local_460 = (float)(iVar5 >> 2);
    local_45c = ~(iVar15 >> 3);
    local_450 = (long)local_4b8;
    local_458 = (long)local_4b4;
    local_488 = (ulong)(uint)((iVar3 + Y) - iVar10);
    local_440 = (ulong)((iVar3 + Y) - 4);
    local_448 = (ulong)((iVar3 + Y) - 1);
    do {
      iVar10 = iVar4;
      if (local_48c != 0) {
        e_00 = expand(this,pcVar14,local_438);
      }
      uVar21 = (undefined4)((ulong)in_stack_fffffffffffffb08 >> 0x20);
      if ((int)local_480 < iVar10) {
        if ((char)uVar1 < '\0') {
LAB_001bab6a:
          if (((local_4b8 < local_4b4) &&
              (pcVar12 = this->value_, local_450 <= (long)e_00 - (long)pcVar12)) &&
             ((long)pcVar14 - (long)pcVar12 < local_458)) {
            e = pcVar12 + local_450;
            local_490 = 0;
            local_4e4 = x;
            if (pcVar14 < e) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)local_4bc);
              dVar17 = expandpos(this,pcVar14,e,local_438,&local_490);
              local_4e4 = (float)dVar17 + x;
              fl_draw(local_438,local_490,x,(float)((int)local_488 + iVar10));
              pcVar12 = this->value_;
            }
            pcVar12 = pcVar12 + local_458;
            if (e_00 < pcVar12) {
              sVar8 = strlen(local_438);
              local_494 = (int)sVar8;
              fVar19 = fVar18;
            }
            else {
              dVar17 = expandpos(this,pcVar14,pcVar12,local_438,&local_494);
              fVar19 = (float)dVar17 + x;
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)(this->super_Fl_Widget).color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,(ulong)(uint)(int)(local_4e4 + 0.5),
                       (ulong)(uint)(Y + iVar10),(ulong)(uint)(int)((fVar19 - local_4e4) + 0.5));
            FVar6 = fl_contrast(this->textcolor_,(this->super_Fl_Widget).color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar6);
            fVar20 = (float)((int)local_488 + iVar10);
            fl_draw(local_438 + local_490,local_494 - local_490,local_4e4,fVar20);
            if (pcVar12 < e_00) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)local_4bc);
              pcVar12 = local_438 + local_494;
              sVar8 = strlen(pcVar12);
              iVar4 = (int)sVar8;
              goto LAB_001bac8f;
            }
          }
          else {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)local_4bc);
            pcVar12 = local_438;
            sVar8 = strlen(pcVar12);
            fVar20 = (float)((int)local_488 + iVar10);
            iVar4 = (int)sVar8;
            fVar19 = x;
LAB_001bac8f:
            fl_draw(pcVar12,iVar4,fVar19,fVar20);
          }
          if (-1 < (char)uVar1) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
          }
        }
        else {
          pcVar12 = this->value_ + this->mu_p;
          if (pcVar12 <= e_00) {
            bVar2 = (this->super_Fl_Widget).type_;
            if ((bVar2 & 8) == 0) {
              bVar16 = this->erase_cursor_only != '\0';
              if ((bVar16) && (pcVar12 < pcVar14)) goto LAB_001bacb3;
            }
            else {
              this->erase_cursor_only = '\0';
              bVar16 = false;
            }
            fVar20 = fVar18;
            if (pcVar14 < pcVar12) {
              dVar17 = expandpos(this,pcVar14,pcVar12,local_438,(int *)0x0);
              fVar19 = (float)dVar17 + x;
              if (this->erase_cursor_only == '\0') {
                if (((this->super_Fl_Widget).type_ & 8) != 0) {
                  fVar19 = fVar19 + -3.0;
                }
              }
              else {
                fVar20 = fVar19 + 2.0;
              }
            }
            else {
              fVar20 = local_468;
              if (!bVar16) {
                fVar20 = fVar18;
              }
              fVar19 = local_464;
              if (!bVar16 && (bVar2 & 8) != 0) {
                fVar20 = fVar18;
                fVar19 = local_46c;
              }
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                      (fl_graphics_driver,(ulong)((int)fVar19 + local_45c),(ulong)(uint)(Y + iVar10)
                       ,(ulong)(uint)(int)((fVar20 - fVar19) + 2.0 + local_460),
                       CONCAT44(extraout_var,iVar3));
            FVar13 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
            iVar4 = Fl::box_dx(FVar13);
            iVar15 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
            iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
            iVar9 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
            FVar6 = (this->super_Fl_Widget).color_;
            in_stack_fffffffffffffb08 = CONCAT44(uVar21,FVar6);
            Fl_Widget::draw_box(&this->super_Fl_Widget,FVar13,X - iVar4,Y - iVar15,iVar5 + W,
                                iVar9 + H,FVar6);
            goto LAB_001bab6a;
          }
        }
LAB_001bacb3:
        if ((local_4b8 == local_4b4) && ((Fl_Input_ *)Fl::focus_ == this)) {
          if (((long)pcVar14 - (long)this->value_ <= (long)this->position_) &&
             ((long)this->position_ <= (long)e_00 - (long)this->value_)) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)this->cursor_color_);
            dVar17 = expandpos(this,pcVar14,this->value_ + this->position_,local_438,(int *)0x0);
            local_478 = (ulong)(uint)(int)(dVar17 + 0.5);
            fVar20 = (float)(int)(dVar17 + 0.5) + x;
            if (((this->super_Fl_Widget).type_ & 8) == 0) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                        (fl_graphics_driver,(ulong)(uint)(int)(fVar20 + 0.5),
                         (ulong)(uint)(Y + iVar10),2);
            }
            else {
              uVar11 = (int)local_448 + iVar10;
              in_stack_fffffffffffffb08 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffb08 >> 0x20),uVar11);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                        (fl_graphics_driver,(ulong)(uint)(int)(fVar20 + -2.5),(ulong)uVar11,
                         (ulong)(uint)(int)(fVar20 + 0.5),(ulong)(uint)((int)local_440 + iVar10),
                         (ulong)(uint)(int)(fVar20 + 3.5),in_stack_fffffffffffffb08);
            }
          }
        }
      }
      if (this->value_ + this->size_ <= e_00) break;
      if ((*e_00 == ' ') || (*e_00 == '\n')) {
        e_00 = e_00 + 1;
      }
      pcVar14 = e_00;
      iVar4 = iVar3 + iVar10;
    } while (iVar3 + iVar10 < H);
    iVar4 = iVar10 + iVar3;
  }
  if ((((-1 < (char)uVar1) && (((this->super_Fl_Widget).type_ & 7) == 4)) && (iVar4 < H)) &&
     ((this->erase_cursor_only == '\0' || (pcVar14 <= this->value_ + this->mu_p)))) {
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = iVar3;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)(Y + iVar4),W,(ulong)(uint)(H - iVar4)
              );
    FVar13 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
    iVar3 = Fl::box_dx(FVar13);
    iVar10 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
    iVar15 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
    iVar5 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar13,X - iVar3,Y - iVar10,W + iVar15,iVar5 + H,
                        (this->super_Fl_Widget).color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  if ((Fl_Input_ *)Fl::focus_ == this) {
    iVar3 = this->textfont_;
    iVar10 = this->textsize_;
    iVar5 = (int)local_478;
    iVar15 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
    win = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(iVar3,iVar10,iVar5 + (int)x,(iVar4 + Y) - iVar15,W,H,win);
  }
  return;
}

Assistant:

void Fl_Input_::drawtext(int X, int Y, int W, int H) {
  int do_mu = !(damage()&FL_DAMAGE_ALL);

  if (Fl::focus()!=this && !size()) {
    if (do_mu) { // we have to erase it if cursor was there
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    }
    return;
  }

  int selstart, selend;
  if (Fl::focus()!=this && /*Fl::selection_owner()!=this &&*/ Fl::pushed()!=this)
    selstart = selend = 0;
  else if (position() <= mark()) {
    selstart = position(); selend = mark();
  } else {
    selend = position(); selstart = mark();
  }

  setfont();
  const char *p, *e;
  char buf[MAXBUF];

  // count how many lines and put the last one into the buffer:
  // And figure out where the cursor is:
  int height = fl_height();
  int threshold = height/2;
  int lines;
  int curx, cury;
  for (p=value(), curx=cury=lines=0; ;) {
    e = expand(p, buf);
    if (position() >= p-value() && position() <= e-value()) {
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (Fl::focus()==this && !was_up_down) up_down_pos = curx;
      cury = lines*height;
      int newscroll = xscroll_;
      if (curx > newscroll+W-threshold) {
	// figure out scrolling so there is space after the cursor:
	newscroll = curx+threshold-W;
	// figure out the furthest left we ever want to scroll:
	int ex = int(expandpos(p, e, buf, 0))+4-W;
	// use minimum of both amounts:
	if (ex < newscroll) newscroll = ex;
      } else if (curx < newscroll+threshold) {
	newscroll = curx-threshold;
      }
      if (newscroll < 0) newscroll = 0;
      if (newscroll != xscroll_) {
	xscroll_ = newscroll;
	mu_p = 0; erase_cursor_only = 0;
      }
    }
    lines++;
    if (e >= value_+size_) break;
    p = e+1;
  }

  // adjust the scrolling:
  if (input_type()==FL_MULTILINE_INPUT) {
    int newy = yscroll_;
    if (cury < newy) newy = cury;
    if (cury > newy+H-height) newy = cury-H+height;
    if (newy < -1) newy = -1;
    if (newy != yscroll_) {yscroll_ = newy; mu_p = 0; erase_cursor_only = 0;}
  } else {
    yscroll_ = -(H-height)/2;
  }

  fl_push_clip(X, Y, W, H);
  Fl_Color tc = active_r() ? textcolor() : fl_inactive(textcolor());

  p = value();
  // visit each line and draw it:
  int desc = height-fl_descent();
  float xpos = (float)(X - xscroll_ + 1);
  int ypos = -yscroll_;
  for (; ypos < H;) {

    // re-expand line unless it is the last one calculated above:
    if (lines>1) e = expand(p, buf);

    if (ypos <= -height) goto CONTINUE; // clipped off top

    if (do_mu) {	// for minimal update:
      const char* pp = value()+mu_p; // pointer to where minimal update starts
      if (e < pp) goto CONTINUE2; // this line is before the changes
      if (readonly()) erase_cursor_only = 0; // this isn't the most efficient way
      if (erase_cursor_only && p > pp) goto CONTINUE2; // this line is after
      // calculate area to erase:
      float r = (float)(X+W);
      float xx;
      if (p >= pp) {
	xx = (float)X;
	if (erase_cursor_only) r = xpos+2;
	else if (readonly()) xx -= 3;
      } else {
	xx = xpos + (float)expandpos(p, pp, buf, 0);
	if (erase_cursor_only) r = xx+2;
	else if (readonly()) xx -= 3;
      }
      // clip to and erase it:
      fl_push_clip((int)xx-1-height/8, Y+ypos, (int)(r-xx+2+height/4), height);
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
      // it now draws entire line over it
      // this should not draw letters to left of erased area, but
      // that is nyi.
    }

    // Draw selection area if required:
    if (selstart < selend && selstart <= e-value() && selend > p-value()) {
      const char* pp = value()+selstart;
      float x1 = xpos;
      int offset1 = 0;
      if (pp > p) {
	fl_color(tc);
	x1 += (float)expandpos(p, pp, buf, &offset1);
	fl_draw(buf, offset1, xpos, (float)(Y+ypos+desc));
      }
      pp = value()+selend;
      float x2 = (float)(X+W);
      int offset2;
      if (pp <= e) x2 = xpos + (float)expandpos(p, pp, buf, &offset2);
      else offset2 = (int) strlen(buf);
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text 
      if (Fl::compose_state) {
        fl_color(textcolor());
      }
      else 
#endif
      {
      fl_color(selection_color());
      fl_rectf((int)(x1+0.5), Y+ypos, (int)(x2-x1+0.5), height);
      fl_color(fl_contrast(textcolor(), selection_color()));
      }
      fl_draw(buf+offset1, offset2-offset1, x1, (float)(Y+ypos+desc));
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text
      if (Fl::compose_state) {
        fl_color( fl_color_average(textcolor(), color(), 0.6) );
        float width = fl_width(buf+offset1, offset2-offset1);
        fl_line(x1, Y+ypos+height-1, x1+width, Y+ypos+height-1);
      }
#endif
      if (pp < e) {
	fl_color(tc);
	fl_draw(buf+offset2, (int) strlen(buf+offset2), x2, (float)(Y+ypos+desc));
      }
    } else {
      // draw unselected text
      fl_color(tc);
      fl_draw(buf, (int) strlen(buf), xpos, (float)(Y+ypos+desc));
    }

    if (do_mu) fl_pop_clip();

  CONTINUE2:
    // draw the cursor:
    if (Fl::focus() == this && (
#ifdef __APPLE__
				Fl::compose_state || 
#endif
				selstart == selend) &&
	position() >= p-value() && position() <= e-value()) {
      fl_color(cursor_color());
      // cursor position may need to be recomputed (see STR #2486)
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (readonly()) {
        fl_line((int)(xpos+curx-2.5f), Y+ypos+height-1,
	        (int)(xpos+curx+0.5f), Y+ypos+height-4,
	        (int)(xpos+curx+3.5f), Y+ypos+height-1);
      } else {
        fl_rectf((int)(xpos+curx+0.5), Y+ypos, 2, height);
      }
#ifdef __APPLE__
      Fl::insertion_point_location(xpos+curx, Y+ypos+height, height);
#endif
    }

  CONTINUE:
    ypos += height;
    if (e >= value_+size_) break;
    if (*e == '\n' || *e == ' ') e++;
    p = e;
  }

  // for minimal update, erase all lines below last one if necessary:
  if (input_type()==FL_MULTILINE_INPUT && do_mu && ypos<H
      && (!erase_cursor_only || p <= value()+mu_p)) {
    if (ypos < 0) ypos = 0;
    fl_push_clip(X, Y+ypos, W, H-ypos);
    draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
             W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    fl_pop_clip();
  }

  fl_pop_clip();
  if (Fl::focus() == this) {
       fl_set_spot(textfont(), textsize(),
               (int)xpos+curx, Y+ypos-fl_descent(), W, H, window());
  }
}